

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  Vdbe *p;
  int p2;
  Parse *pParse_00;
  int target;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char affinity;
  int rRhsHasNull;
  int local_44;
  int local_40;
  int local_3c;
  Parse *local_38;
  
  rRhsHasNull = 0;
  p = pParse->pVdbe;
  local_44 = sqlite3FindInIndex(pParse,pExpr,&rRhsHasNull);
  affinity = comparisonAffinity(pExpr);
  pParse->iCacheLevel = pParse->iCacheLevel + 1;
  target = sqlite3GetTempReg(pParse);
  local_38 = pParse;
  sqlite3ExprCode(pParse,pExpr->pLeft,target);
  local_40 = destIfFalse;
  if (destIfNull == destIfFalse) {
    sqlite3VdbeAddOp2(p,0x49,target,destIfNull);
  }
  else {
    uVar1 = sqlite3VdbeAddOp1(p,0x4a,target);
    sqlite3VdbeAddOp2(p,0x48,pExpr->iTable,destIfFalse);
    sqlite3VdbeAddOp2(p,1,0,destIfNull);
    if ((-1 < (int)uVar1) && (uVar1 < (uint)p->nOp)) {
      p->aOp[uVar1].p2 = p->nOp;
    }
  }
  p2 = local_40;
  if (local_44 == 1) {
    sqlite3VdbeAddOp2(p,0x15,target,local_40);
    sqlite3VdbeAddOp3(p,0x36,pExpr->iTable,p2,target);
  }
  else {
    sqlite3VdbeAddOp4(p,0x1e,target,1,0,&affinity,1);
    if ((destIfNull == local_40) || (rRhsHasNull == 0)) {
      sqlite3VdbeAddOp4Int(p,0x33,pExpr->iTable,local_40,target,1);
    }
    else {
      local_44 = target;
      local_3c = destIfNull;
      uVar1 = sqlite3VdbeAddOp4Int(p,0x34,pExpr->iTable,0,target,1);
      uVar2 = sqlite3VdbeAddOp1(p,0x4a,rRhsHasNull);
      uVar3 = sqlite3VdbeAddOp4Int(p,0x34,pExpr->iTable,0,rRhsHasNull,1);
      sqlite3VdbeAddOp2(p,7,-1,rRhsHasNull);
      if ((-1 < (int)uVar3) && (uVar3 < (uint)p->nOp)) {
        p->aOp[uVar3].p2 = p->nOp;
      }
      sqlite3VdbeAddOp2(p,0x14,rRhsHasNull,1);
      if ((-1 < (int)uVar2) && (uVar2 < (uint)p->nOp)) {
        p->aOp[uVar2].p2 = p->nOp;
      }
      sqlite3VdbeAddOp2(p,0x1b,rRhsHasNull,local_3c);
      sqlite3VdbeAddOp2(p,1,0,local_40);
      target = local_44;
      if ((-1 < (int)uVar1) && (uVar1 < (uint)p->nOp)) {
        p->aOp[uVar1].p2 = p->nOp;
      }
    }
  }
  pParse_00 = local_38;
  sqlite3ReleaseTempReg(local_38,target);
  sqlite3ExprCachePop(pParse_00,target);
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  char affinity;        /* Comparison affinity to use */
  int eType;            /* Type of the RHS */
  int r1;               /* Temporary use register */
  Vdbe *v;              /* Statement under construction */

  /* Compute the RHS.   After this step, the table with cursor
  ** pExpr->iTable will contains the values that make up the RHS.
  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr, &rRhsHasNull);

  /* Figure out the affinity to use to create a key from the results
  ** of the expression. affinityStr stores a static string suitable for
  ** P4 of OP_MakeRecord.
  */
  affinity = comparisonAffinity(pExpr);

  /* Code the LHS, the <expr> from "<expr> IN (...)".
  */
  sqlite3ExprCachePush(pParse);
  r1 = sqlite3GetTempReg(pParse);
  sqlite3ExprCode(pParse, pExpr->pLeft, r1);

  /* If the LHS is NULL, then the result is either false or NULL depending
  ** on whether the RHS is empty or not, respectively.
  */
  if( destIfNull==destIfFalse ){
    /* Shortcut for the common case where the false and NULL outcomes are
    ** the same. */
    sqlite3VdbeAddOp2(v, OP_IsNull, r1, destIfNull);
  }else{
    int addr1 = sqlite3VdbeAddOp1(v, OP_NotNull, r1);
    sqlite3VdbeAddOp2(v, OP_Rewind, pExpr->iTable, destIfFalse);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
    sqlite3VdbeJumpHere(v, addr1);
  }

  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree
    */
    sqlite3VdbeAddOp2(v, OP_MustBeInt, r1, destIfFalse);
    sqlite3VdbeAddOp3(v, OP_NotExists, pExpr->iTable, destIfFalse, r1);
  }else{
    /* In this case, the RHS is an index b-tree.
    */
    sqlite3VdbeAddOp4(v, OP_Affinity, r1, 1, 0, &affinity, 1);

    /* If the set membership test fails, then the result of the 
    ** "x IN (...)" expression must be either 0 or NULL. If the set
    ** contains no NULL values, then the result is 0. If the set 
    ** contains one or more NULL values, then the result of the
    ** expression is also NULL.
    */
    if( rRhsHasNull==0 || destIfFalse==destIfNull ){
      /* This branch runs if it is known at compile time that the RHS
      ** cannot contain NULL values. This happens as the result
      ** of a "NOT NULL" constraint in the database schema.
      **
      ** Also run this branch if NULL is equivalent to FALSE
      ** for this particular IN operator.
      */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, pExpr->iTable, destIfFalse, r1, 1);

    }else{
      /* In this branch, the RHS of the IN might contain a NULL and
      ** the presence of a NULL on the RHS makes a difference in the
      ** outcome.
      */
      int j1, j2, j3;

      /* First check to see if the LHS is contained in the RHS.  If so,
      ** then the presence of NULLs in the RHS does not matter, so jump
      ** over all of the code that follows.
      */
      j1 = sqlite3VdbeAddOp4Int(v, OP_Found, pExpr->iTable, 0, r1, 1);

      /* Here we begin generating code that runs if the LHS is not
      ** contained within the RHS.  Generate additional code that
      ** tests the RHS for NULLs.  If the RHS contains a NULL then
      ** jump to destIfNull.  If there are no NULLs in the RHS then
      ** jump to destIfFalse.
      */
      j2 = sqlite3VdbeAddOp1(v, OP_NotNull, rRhsHasNull);
      j3 = sqlite3VdbeAddOp4Int(v, OP_Found, pExpr->iTable, 0, rRhsHasNull, 1);
      sqlite3VdbeAddOp2(v, OP_Integer, -1, rRhsHasNull);
      sqlite3VdbeJumpHere(v, j3);
      sqlite3VdbeAddOp2(v, OP_AddImm, rRhsHasNull, 1);
      sqlite3VdbeJumpHere(v, j2);

      /* Jump to the appropriate target depending on whether or not
      ** the RHS contains a NULL
      */
      sqlite3VdbeAddOp2(v, OP_If, rRhsHasNull, destIfNull);
      sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);

      /* The OP_Found at the top of this branch jumps here when true, 
      ** causing the overall IN expression evaluation to fall through.
      */
      sqlite3VdbeJumpHere(v, j1);
    }
  }
  sqlite3ReleaseTempReg(pParse, r1);
  sqlite3ExprCachePop(pParse, 1);
  VdbeComment((v, "end IN expr"));
}